

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O0

void __thiscall funnyStrings_underscore_Test::TestBody(funnyStrings_underscore_Test *this)

{
  bool bVar1;
  int iVar2;
  uint64_t uVar3;
  char *pcVar4;
  char *in_R9;
  double __value;
  precise_unit pVar5;
  string local_2c0;
  AssertHelper local_2a0;
  Message local_298;
  allocator local_289;
  string local_288;
  precise_unit local_268;
  bool local_251;
  undefined1 local_250 [8];
  AssertionResult gtest_ar__2;
  Message local_238;
  allocator local_229;
  string local_228;
  precise_unit local_208;
  precise_unit local_1f8;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar_2;
  Message local_1d0;
  allocator local_1c1;
  string local_1c0;
  uint32_t local_1a0;
  uint32_t local_19c;
  undefined1 local_198 [8];
  AssertionResult gtest_ar_1;
  string local_180;
  undefined1 local_160 [8];
  precise_unit ukittens;
  Message local_148;
  allocator local_139;
  string local_138;
  precise_unit local_118;
  precise_unit local_108;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar;
  AssertHelper local_c8;
  Message local_c0;
  bool local_b1;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_80;
  Message local_78;
  bool local_69;
  undefined1 local_68 [8];
  AssertionResult gtest_ar_;
  allocator local_41;
  string local_40;
  undefined1 local_20 [8];
  precise_unit bigNumber;
  funnyStrings_underscore_Test *this_local;
  
  bigNumber._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_40,"_45_625_252_22524_252452_25242522562_E522_",&local_41);
  uVar3 = units::getDefaultFlags();
  pVar5 = units::unit_from_string(&local_40,uVar3);
  bigNumber.multiplier_ = pVar5._8_8_;
  local_20 = (undefined1  [8])pVar5.multiplier_;
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_69 = units::isfinite((precise_unit *)local_20);
  local_69 = !local_69;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_68,&local_69,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_68,
               (AssertionResult *)"isfinite(bigNumber)","true","false",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x6f4,pcVar4);
    testing::internal::AssertHelper::operator=(&local_80,&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  iVar2 = units::isinf(__value);
  local_b1 = SUB41(iVar2,0);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_b0,&local_b1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_b0,
               (AssertionResult *)"isinf(bigNumber)","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x6f5,pcVar4);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  units::precise_unit::precise_unit(&local_108,45625252.0,(precise_unit *)units::precise::m);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_138,"_45_625_252_m_",&local_139);
  uVar3 = units::getDefaultFlags();
  local_118 = units::unit_from_string(&local_138,uVar3);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_f8,"precise_unit(45625252.0, precise::m)",
             "unit_from_string(\"_45_625_252_m_\")",&local_108,&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(&local_148);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&ukittens.base_units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x6f9,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&ukittens.base_units_,&local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ukittens.base_units_);
    testing::Message::~Message(&local_148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_180,"_45_625_252_kittens_",
             (allocator *)
             ((long)&gtest_ar_1.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  uVar3 = units::getDefaultFlags();
  pVar5 = units::unit_from_string(&local_180,uVar3);
  ukittens.multiplier_ = pVar5._8_8_;
  local_160 = (undefined1  [8])pVar5.multiplier_;
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar_1.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_19c = units::precise_unit::commodity((precise_unit *)local_160);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1c0,"kittens",&local_1c1);
  local_1a0 = units::getCommodity(&local_1c0);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_198,"ukittens.commodity()","getCommodity(\"kittens\")",&local_19c,
             &local_1a0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar1) {
    testing::Message::Message(&local_1d0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x6fc,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_1d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  units::precise_unit::precise_unit(&local_1f8,45.0,(precise_unit *)units::precise::one);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_228,"45",&local_229);
  uVar3 = units::getDefaultFlags();
  local_208 = units::unit_from_string(&local_228,uVar3);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_1e8,"precise_unit(45.0, precise::one)","unit_from_string(\"45\")",
             &local_1f8,&local_208);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
  if (!bVar1) {
    testing::Message::Message(&local_238);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x6fe,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_238);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_288,"_____-_____",&local_289);
  uVar3 = units::getDefaultFlags();
  local_268 = units::unit_from_string(&local_288,uVar3);
  bVar1 = units::is_valid(&local_268);
  local_251 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_250,&local_251,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator((allocator<char> *)&local_289);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
  if (!bVar1) {
    testing::Message::Message(&local_298);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2c0,(internal *)local_250,
               (AssertionResult *)"is_valid(unit_from_string(\"_____-_____\"))","true","false",in_R9
              );
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x700,pcVar4);
    testing::internal::AssertHelper::operator=(&local_2a0,&local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_2a0);
    std::__cxx11::string::~string((string *)&local_2c0);
    testing::Message::~Message(&local_298);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
  return;
}

Assistant:

TEST(funnyStrings, underscore)
{
    auto bigNumber =
        unit_from_string("_45_625_252_22524_252452_25242522562_E522_");
    EXPECT_FALSE(isfinite(bigNumber));
    EXPECT_TRUE(isinf(bigNumber));

    EXPECT_EQ(
        precise_unit(45625252.0, precise::m),
        unit_from_string("_45_625_252_m_"));

    auto ukittens = unit_from_string("_45_625_252_kittens_");
    EXPECT_EQ(ukittens.commodity(), getCommodity("kittens"));

    EXPECT_EQ(precise_unit(45.0, precise::one), unit_from_string("45"));

    EXPECT_FALSE(is_valid(unit_from_string("_____-_____")));
}